

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O2

void __thiscall QPrintDialogPrivate::updateWidgets(QPrintDialogPrivate *this)

{
  QPrintDialog *this_00;
  QGroupBox *pQVar1;
  QRadioButton *pQVar2;
  QCheckBox *pQVar3;
  QSpinBox *pQVar4;
  bool bVar5;
  bool bVar6;
  PrintRange PVar7;
  int iVar8;
  QRadioButton **ppQVar9;
  
  this_00 = *(QPrintDialog **)&(this->super_QAbstractPrintDialogPrivate).field_0x8;
  pQVar1 = (this->options).super_Ui_QPrintSettingsOutput.gbPrintRange;
  bVar5 = QPrintDialog::testOption(this_00,PrintPageRange);
  bVar6 = true;
  if ((!bVar5) && (bVar5 = QPrintDialog::testOption(this_00,PrintSelection), !bVar5)) {
    bVar6 = QPrintDialog::testOption(this_00,PrintCurrentPage);
  }
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,bVar6);
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.printRange;
  QPrintDialog::testOption(this_00,PrintPageRange);
  QWidget::setEnabled(SUB81(pQVar2,0));
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.printSelection;
  bVar5 = QPrintDialog::testOption(this_00,PrintSelection);
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,bVar5);
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.printCurrentPage;
  bVar5 = QPrintDialog::testOption(this_00,PrintCurrentPage);
  (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,bVar5);
  pQVar3 = (this->options).super_Ui_QPrintSettingsOutput.collate;
  bVar5 = QPrintDialog::testOption(this_00,PrintCollateCopies);
  (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,bVar5);
  PVar7 = QAbstractPrintDialog::printRange((QAbstractPrintDialog *)this_00);
  if (PVar7 < 4) {
    ppQVar9 = &(this->options).super_Ui_QPrintSettingsOutput.printSelection;
    switch(PVar7) {
    case AllPages:
      ppQVar9 = &(this->options).super_Ui_QPrintSettingsOutput.printAll;
      break;
    case PageRange:
      ppQVar9 = &(this->options).super_Ui_QPrintSettingsOutput.printRange;
      break;
    case CurrentPage:
      bVar5 = QPrintDialog::testOption(this_00,PrintCurrentPage);
      if (!bVar5) goto LAB_001420c6;
      ppQVar9 = &(this->options).super_Ui_QPrintSettingsOutput.printCurrentPage;
    }
    QAbstractButton::setChecked(SUB81(*ppQVar9,0));
    QWidget::setEnabled(SUB81((this->options).super_Ui_QPrintSettingsOutput.pageSetCombo,0));
  }
LAB_001420c6:
  QAbstractPrintDialog::minPage((QAbstractPrintDialog *)this_00);
  QAbstractPrintDialog::maxPage((QAbstractPrintDialog *)this_00);
  iVar8 = QAbstractPrintDialog::maxPage((QAbstractPrintDialog *)this_00);
  if (iVar8 != 0x7fffffff) {
    QAbstractPrintDialog::maxPage((QAbstractPrintDialog *)this_00);
  }
  QSpinBox::setMinimum((int)(this->options).super_Ui_QPrintSettingsOutput.from);
  QSpinBox::setMinimum((int)(this->options).super_Ui_QPrintSettingsOutput.to);
  QSpinBox::setMaximum((int)(this->options).super_Ui_QPrintSettingsOutput.from);
  QSpinBox::setMaximum((int)(this->options).super_Ui_QPrintSettingsOutput.to);
  pQVar4 = (this->options).super_Ui_QPrintSettingsOutput.from;
  QAbstractPrintDialog::fromPage((QAbstractPrintDialog *)this_00);
  QSpinBox::setValue((int)pQVar4);
  pQVar4 = (this->options).super_Ui_QPrintSettingsOutput.to;
  QAbstractPrintDialog::toPage((QAbstractPrintDialog *)this_00);
  QSpinBox::setValue((int)pQVar4);
  QUnixPrintWidgetPrivate::updateWidget(this->top->d);
  return;
}

Assistant:

void QPrintDialogPrivate::updateWidgets()
{
    Q_Q(QPrintDialog);
    options.gbPrintRange->setVisible(q->testOption(QPrintDialog::PrintPageRange) ||
                                     q->testOption(QPrintDialog::PrintSelection) ||
                                     q->testOption(QPrintDialog::PrintCurrentPage));

    options.printRange->setEnabled(q->testOption(QPrintDialog::PrintPageRange));
    options.printSelection->setVisible(q->testOption(QPrintDialog::PrintSelection));
    options.printCurrentPage->setVisible(q->testOption(QPrintDialog::PrintCurrentPage));
    options.collate->setVisible(q->testOption(QPrintDialog::PrintCollateCopies));

#if QT_CONFIG(cups)
    // Don't display Page Set if only Selection or Current Page are enabled
    if (!q->testOption(QPrintDialog::PrintPageRange)
        && (q->testOption(QPrintDialog::PrintSelection) || q->testOption(QPrintDialog::PrintCurrentPage))) {
        options.pageSetCombo->setVisible(false);
        options.pageSetLabel->setVisible(false);
    } else {
        options.pageSetCombo->setVisible(true);
        options.pageSetLabel->setVisible(true);
    }

    if (!q->testOption(QPrintDialog::PrintPageRange)) {
        // If we can do CUPS server side pages selection,
        // display the page range widgets
        options.gbPrintRange->setVisible(true);
        options.printRange->setEnabled(true);
    }
#endif

    switch (q->printRange()) {
    case QPrintDialog::AllPages:
        options.printAll->setChecked(true);
        options.pageSetCombo->setEnabled(true);
        break;
    case QPrintDialog::Selection:
        options.printSelection->setChecked(true);
        options.pageSetCombo->setEnabled(false);
        break;
    case QPrintDialog::PageRange:
        options.printRange->setChecked(true);
        options.pageSetCombo->setEnabled(true);
        break;
    case QPrintDialog::CurrentPage:
        if (q->testOption(QPrintDialog::PrintCurrentPage)) {
            options.printCurrentPage->setChecked(true);
            options.pageSetCombo->setEnabled(false);
        }
        break;
    default:
        break;
    }
    const int minPage = qMax(1, qMin(q->minPage() , q->maxPage()));
    const int maxPage = qMax(1, q->maxPage() == INT_MAX ? 9999 : q->maxPage());

    options.from->setMinimum(minPage);
    options.to->setMinimum(minPage);
    options.from->setMaximum(maxPage);
    options.to->setMaximum(maxPage);

    options.from->setValue(q->fromPage());
    options.to->setValue(q->toPage());
    top->d->updateWidget();
}